

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xInstPrinter.c
# Opt level: O1

void printRegPair(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  byte bVar2;
  cs_detail *pcVar3;
  uint uVar4;
  MCOperand *op;
  long lVar5;
  
  op = MCInst_getOperand(MI,OpNo);
  uVar4 = MCOperand_getReg(op);
  SStream_concat(O,"%s:%s",
                 getRegisterName_AsmStrs +
                 *(ushort *)(getRegisterName_RegAsmOffset + (ulong)uVar4 * 2),
                 getRegisterName_AsmStrs +
                 *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar4 - 1) * 2));
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar3 = MI->flat_insn->detail;
    bVar2 = (pcVar3->field_6).x86.prefix[0];
    lVar5 = (ulong)bVar2 * 0x20;
    puVar1 = pcVar3->groups + lVar5 + 0x11;
    puVar1[0] = '@';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(uint *)(pcVar3->groups + lVar5 + 0x15) = uVar4;
    (pcVar3->field_6).x86.prefix[0] = bVar2 + 1;
  }
  return;
}

Assistant:

static void printRegPair(MCInst *MI, unsigned OpNo, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNo);
	unsigned reg = MCOperand_getReg(Op);
	cs_tms320c64x *tms320c64x;

	SStream_concat(O, "%s:%s", getRegisterName(reg + 1), getRegisterName(reg));

	if (MI->csh->detail) {
		tms320c64x = &MI->flat_insn->detail->tms320c64x;

		tms320c64x->operands[tms320c64x->op_count].type = TMS320C64X_OP_REGPAIR;
		tms320c64x->operands[tms320c64x->op_count].reg = reg;
		tms320c64x->op_count++;
	}
}